

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

int Utf8ComputeByteLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  size_t i;
  uint *puStack_48;
  Col_Char c;
  char *p;
  size_t *byteLengthPtr;
  Col_ClientData clientData_local;
  Col_RopeChunk *chunks_local;
  size_t number_local;
  size_t length_local;
  size_t index_local;
  
  puStack_48 = (uint *)chunks->data;
  local_58 = 0;
  while( true ) {
    if (length <= local_58) {
      return 0;
    }
    if (chunks->format == COL_UCS1) {
      local_5c = (uint)(byte)*puStack_48;
    }
    else {
      if (chunks->format == COL_UCS2) {
        local_60 = (uint)(ushort)*puStack_48;
      }
      else {
        if (chunks->format == COL_UCS4) {
          local_64 = *puStack_48;
        }
        else {
          if (chunks->format == COL_UTF8) {
            local_68 = Col_Utf8Get((Col_Char1 *)puStack_48);
          }
          else {
            if (chunks->format == COL_UTF16) {
              local_6c = Col_Utf16Get((Col_Char2 *)puStack_48);
            }
            else {
              local_6c = 0xffffffff;
            }
            local_68 = local_6c;
          }
          local_64 = local_68;
        }
        local_60 = local_64;
      }
      local_5c = local_60;
    }
    if (local_5c < 0x80) {
      local_70 = 1;
    }
    else {
      if (local_5c < 0x800) {
        local_74 = 2;
      }
      else {
        if (local_5c < 0xd800) {
          local_78 = 3;
        }
        else {
          if (local_5c < 0xe000) {
            local_7c = 0;
          }
          else {
            if (local_5c < 0x10000) {
              local_80 = 3;
            }
            else {
              local_80 = 0;
              if (local_5c < 0x110000) {
                local_80 = 4;
              }
            }
            local_7c = local_80;
          }
          local_78 = local_7c;
        }
        local_74 = local_78;
      }
      local_70 = local_74;
    }
    *(long *)clientData = (long)local_70 + *clientData;
    if (0xfda < *clientData) break;
    local_58 = local_58 + 1;
    if (chunks->format == COL_UCS1) {
      local_88 = (uint *)((long)puStack_48 + 1);
    }
    else {
      if (chunks->format == COL_UCS2) {
        local_90 = (uint *)((long)puStack_48 + 2);
      }
      else {
        if (chunks->format == COL_UCS4) {
          local_98 = puStack_48 + 1;
        }
        else {
          if (chunks->format == COL_UTF8) {
            local_a0 = (uint *)Col_Utf8Next((Col_Char1 *)puStack_48);
          }
          else {
            if (chunks->format == COL_UTF16) {
              local_a8 = (uint *)Col_Utf16Next((Col_Char2 *)puStack_48);
            }
            else {
              local_a8 = (uint *)0x0;
            }
            local_a0 = local_a8;
          }
          local_98 = local_a0;
        }
        local_90 = local_98;
      }
      local_88 = local_90;
    }
    puStack_48 = local_88;
  }
  return 1;
}

Assistant:

static int
Utf8ComputeByteLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *byteLengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        *byteLengthPtr += COL_UTF8_WIDTH(c) * CHAR_WIDTH(COL_UTF8);

        /*!
         * @retval 1 stops traversal if byte length exceeds
         * #UTFSTR_MAX_BYTELENGTH.
         */

        if (*byteLengthPtr > UTFSTR_MAX_BYTELENGTH) return 1;
    }

    /*!
     * @retval 0 will continue traversal.
     */

    return 0;
}